

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::createInstance
          (BeagleCPUImpl<float,_1,_0> *this,int tipCount,int partialsBufferCount,
          int compactBufferCount,int stateCount,int patternCount,int eigenDecompositionCount,
          int matrixCount,int categoryCount,int scaleBufferCount,int resourceNumber,
          int pluginResourceNumber,long preferenceFlags,long requirementFlags)

{
  size_t __size;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  byte bVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  EigenDecompositionSquare<float,_1> *this_00;
  double **ppdVar22;
  double *pdVar23;
  float **ppfVar24;
  int **ppiVar25;
  float *pfVar26;
  float *pfVar27;
  void *pvVar28;
  int *piVar29;
  undefined8 *puVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  size_t sVar38;
  ulong uVar39;
  ushort uVar40;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 in_ZMM5 [64];
  float *local_90;
  size_t local_88;
  float ***local_80;
  undefined1 local_78 [64];
  
  this->realtypeMin = 1.1754944e-38;
  this->scalingExponentThreshold = 0x14;
  *(int *)&(this->super_BeagleImpl).field_0xc = partialsBufferCount + compactBufferCount;
  this->kTipCount = tipCount;
  this->kStateCount = stateCount;
  this->kPatternCount = patternCount;
  this->kPartitionCount = 1;
  this->kMaxPartitionCount = 1;
  this->kPartitionsInitialised = false;
  this->kPatternsReordered = false;
  this->kInternalPartialsBufferCount = (partialsBufferCount + compactBufferCount) - tipCount;
  this->kTransPaddedStateCount = stateCount + 1;
  this->kPartialsPaddedStateCount = stateCount;
  iVar19 = (*(this->super_BeagleImpl)._vptr_BeagleImpl[0x5c])();
  iVar33 = this->kStateCount;
  iVar32 = this->kPatternCount % iVar19;
  iVar19 = iVar19 - iVar32;
  if (iVar32 == 0) {
    iVar19 = 0;
  }
  uVar36 = requirementFlags | preferenceFlags;
  iVar32 = this->kPatternCount + iVar19;
  this->kPaddedPatternCount = iVar32;
  this->kExtraPatterns = iVar19;
  this->kMatrixCount = matrixCount;
  this->kEigenDecompCount = eigenDecompositionCount;
  this->kCategoryCount = categoryCount;
  this->kScaleBufferCount = scaleBufferCount;
  this->kMatrixSize = (iVar33 + 1) * iVar33;
  this->kFlags = 0;
  uVar20 = (uint)uVar36;
  if ((char)uVar36 < '\0') {
    this->kFlags = 0x480;
    this->kScaleBufferCount = this->kInternalPartialsBufferCount;
    lVar21 = 0x480;
  }
  else if ((uVar20 >> 8 & 1) == 0) {
    if ((uVar20 >> 0x19 & 1) == 0) {
      if ((uVar20 >> 10 & 1) == 0) {
        lVar21 = 0x240;
        this->kFlags = 0x240;
      }
      else {
        this->kFlags = 0x440;
        lVar21 = 0x440;
      }
    }
    else {
      this->kFlags = 0x2000200;
      lVar21 = 0x2000200;
    }
  }
  else {
    this->kFlags = 0x500;
    this->kScaleBufferCount = this->kInternalPartialsBufferCount + 1;
    lVar21 = 0x500;
  }
  uVar34 = 0x40000000;
  if ((uVar20 >> 0x1e & 1) == 0) {
    uVar34 = 0x4000;
  }
  lVar21 = (ulong)(((uVar20 & 0x20) >> 5) << 4) + lVar21 + 0x100010 +
           (uVar34 | (uint)(uVar36 >> 1) & 0x100000);
  this->kFlags = lVar21;
  if ((uVar36 & 0x20) == 0) {
    this_00 = (EigenDecompositionSquare<float,_1> *)operator_new(0x48);
    EigenDecompositionCube<float,_1>::EigenDecompositionCube
              ((EigenDecompositionCube<float,_1> *)this_00,eigenDecompositionCount,iVar33,
               categoryCount,lVar21);
  }
  else {
    this_00 = (EigenDecompositionSquare<float,_1> *)operator_new(0x58);
    EigenDecompositionSquare<float,_1>::EigenDecompositionSquare
              (this_00,eigenDecompositionCount,iVar33,categoryCount,lVar21);
  }
  this->gEigenDecomposition = &this_00->super_EigenDecomposition<float,_1>;
  sVar38 = (size_t)this->kEigenDecompCount;
  ppdVar22 = (double **)calloc(8,sVar38);
  this->gCategoryRates = ppdVar22;
  if (ppdVar22 != (double **)0x0) {
    pdVar23 = (double *)malloc((long)this->kPatternCount << 3);
    this->gPatternWeights = pdVar23;
    if (pdVar23 != (double *)0x0) {
      this->kPartialsSize =
           this->kPartialsPaddedStateCount * this->kPaddedPatternCount * this->kCategoryCount;
      iVar33 = *(int *)&(this->super_BeagleImpl).field_0xc;
      __size = (long)iVar33 * 8;
      ppfVar24 = (float **)malloc(__size);
      this->gPartials = ppfVar24;
      if (ppfVar24 != (float **)0x0) {
        ppfVar24 = (float **)calloc(8,sVar38);
        this->gStateFrequencies = ppfVar24;
        if (ppfVar24 != (float **)0x0) {
          ppfVar24 = (float **)calloc(8,sVar38);
          this->gCategoryWeights = ppfVar24;
          if (ppfVar24 != (float **)0x0) {
            ppiVar25 = (int **)malloc(__size);
            this->gTipStates = ppiVar25;
            if (ppiVar25 != (int **)0x0) {
              if (0 < iVar33) {
                lVar21 = 0;
                do {
                  this->gPartials[lVar21] = (float *)0x0;
                  this->gTipStates[lVar21] = (int *)0x0;
                  lVar21 = lVar21 + 1;
                } while (iVar33 != lVar21);
              }
              lVar21 = (long)this->kTipCount;
              if (this->kTipCount < iVar33) {
                do {
                  local_90 = (float *)0x0;
                  posix_memalign(&local_90,0x20,(long)this->kPartialsSize << 2);
                  this->gPartials[lVar21] = local_90;
                  if (this->gPartials[lVar21] == (float *)0x0) goto LAB_001311ec;
                  lVar21 = lVar21 + 1;
                } while (lVar21 < *(int *)&(this->super_BeagleImpl).field_0xc);
              }
              this->gScaleBuffers = (float **)0x0;
              this->gAutoScaleBuffers = (short **)0x0;
              iVar33 = this->kScaleBufferCount;
              lVar37 = (long)iVar33;
              lVar21 = this->kFlags;
              ppfVar24 = (float **)malloc(lVar37 * 8);
              auVar60 = in_ZMM5._0_16_;
              if ((char)lVar21 < '\0') {
                this->gAutoScaleBuffers = (short **)ppfVar24;
                if (ppfVar24 == (float **)0x0) goto LAB_001311ec;
                if (0 < iVar33) {
                  lVar21 = 0;
                  do {
                    pfVar26 = (float *)malloc((long)iVar32 * 2);
                    auVar60 = in_ZMM5._0_16_;
                    ppfVar24[lVar21] = pfVar26;
                    ppfVar24 = (float **)this->gAutoScaleBuffers;
                    if (ppfVar24[lVar21] == (float *)0x0) goto LAB_001311ec;
                    lVar21 = lVar21 + 1;
                  } while (lVar37 != lVar21);
                }
                piVar29 = (int *)malloc((long)this->kInternalPartialsBufferCount << 2);
                this->gActiveScalingFactors = piVar29;
                ppfVar24 = (float **)malloc(8);
                this->gScaleBuffers = ppfVar24;
                pfVar26 = (float *)malloc((long)iVar32 << 2);
                *ppfVar24 = pfVar26;
              }
              else {
                local_80 = &this->gScaleBuffers;
                *local_80 = ppfVar24;
                if (ppfVar24 == (float **)0x0) goto LAB_001311ec;
                if (0 < iVar33) {
                  local_88 = (long)iVar32 << 2;
                  lVar35 = 0;
                  auVar41 = vpbroadcastq_avx512f();
                  local_78 = vmovdqu64_avx512f(auVar41);
                  do {
                    pfVar26 = (float *)malloc(local_88);
                    ppfVar24[lVar35] = pfVar26;
                    ppfVar24 = *local_80;
                    pfVar26 = ppfVar24[lVar35];
                    if (pfVar26 == (float *)0x0) goto LAB_001311ec;
                    auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                    auVar60 = auVar41._0_16_;
                    auVar42 = vmovdqu64_avx512f(local_78);
                    auVar43 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                    auVar44 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    if (0 < iVar32 && ((uint)lVar21 >> 0x19 & 1) != 0) {
                      uVar36 = 0;
                      do {
                        auVar45 = vpbroadcastq_avx512f();
                        auVar46 = vporq_avx512f(auVar45,auVar43);
                        auVar45 = vporq_avx512f(auVar45,auVar44);
                        uVar16 = vpcmpuq_avx512f(auVar45,auVar42,2);
                        uVar17 = vpcmpuq_avx512f(auVar46,auVar42,2);
                        bVar18 = (byte)uVar17;
                        uVar40 = CONCAT11(bVar18,(byte)uVar16);
                        pfVar27 = pfVar26 + uVar36;
                        bVar2 = (bool)((byte)uVar16 & 1);
                        bVar3 = (bool)((byte)(uVar40 >> 1) & 1);
                        bVar4 = (bool)((byte)(uVar40 >> 2) & 1);
                        bVar5 = (bool)((byte)(uVar40 >> 3) & 1);
                        bVar6 = (bool)((byte)(uVar40 >> 4) & 1);
                        bVar7 = (bool)((byte)(uVar40 >> 5) & 1);
                        bVar8 = (bool)((byte)(uVar40 >> 6) & 1);
                        bVar9 = (bool)((byte)(uVar40 >> 7) & 1);
                        bVar10 = (bool)(bVar18 >> 1 & 1);
                        bVar11 = (bool)(bVar18 >> 2 & 1);
                        bVar12 = (bool)(bVar18 >> 3 & 1);
                        bVar13 = (bool)(bVar18 >> 4 & 1);
                        bVar14 = (bool)(bVar18 >> 5 & 1);
                        bVar15 = (bool)(bVar18 >> 6 & 1);
                        *pfVar27 = (float)((uint)bVar2 * auVar41._0_4_ |
                                          (uint)!bVar2 * (int)*pfVar27);
                        pfVar27[1] = (float)((uint)bVar3 * auVar41._4_4_ |
                                            (uint)!bVar3 * (int)pfVar27[1]);
                        pfVar27[2] = (float)((uint)bVar4 * auVar41._8_4_ |
                                            (uint)!bVar4 * (int)pfVar27[2]);
                        pfVar27[3] = (float)((uint)bVar5 * auVar41._12_4_ |
                                            (uint)!bVar5 * (int)pfVar27[3]);
                        pfVar27[4] = (float)((uint)bVar6 * auVar41._16_4_ |
                                            (uint)!bVar6 * (int)pfVar27[4]);
                        pfVar27[5] = (float)((uint)bVar7 * auVar41._20_4_ |
                                            (uint)!bVar7 * (int)pfVar27[5]);
                        pfVar27[6] = (float)((uint)bVar8 * auVar41._24_4_ |
                                            (uint)!bVar8 * (int)pfVar27[6]);
                        pfVar27[7] = (float)((uint)bVar9 * auVar41._28_4_ |
                                            (uint)!bVar9 * (int)pfVar27[7]);
                        pfVar27[8] = (float)((uint)(bVar18 & 1) * auVar41._32_4_ |
                                            (uint)!(bool)(bVar18 & 1) * (int)pfVar27[8]);
                        pfVar27[9] = (float)((uint)bVar10 * auVar41._36_4_ |
                                            (uint)!bVar10 * (int)pfVar27[9]);
                        pfVar27[10] = (float)((uint)bVar11 * auVar41._40_4_ |
                                             (uint)!bVar11 * (int)pfVar27[10]);
                        pfVar27[0xb] = (float)((uint)bVar12 * auVar41._44_4_ |
                                              (uint)!bVar12 * (int)pfVar27[0xb]);
                        pfVar27[0xc] = (float)((uint)bVar13 * auVar41._48_4_ |
                                              (uint)!bVar13 * (int)pfVar27[0xc]);
                        pfVar27[0xd] = (float)((uint)bVar14 * auVar41._52_4_ |
                                              (uint)!bVar14 * (int)pfVar27[0xd]);
                        pfVar27[0xe] = (float)((uint)bVar15 * auVar41._56_4_ |
                                              (uint)!bVar15 * (int)pfVar27[0xe]);
                        pfVar27[0xf] = (float)((uint)(bVar18 >> 7) * auVar41._60_4_ |
                                              (uint)!(bool)(bVar18 >> 7) * (int)pfVar27[0xf]);
                        uVar36 = uVar36 + 0x10;
                      } while ((iVar32 + 0xfU & 0xfffffff0) != uVar36);
                    }
                    lVar35 = lVar35 + 1;
                  } while (lVar35 != lVar37);
                }
              }
              iVar33 = this->kMatrixCount;
              auVar41 = ZEXT1664(auVar60);
              ppfVar24 = (float **)malloc((long)iVar33 * 8);
              auVar60 = auVar41._0_16_;
              this->gTransitionMatrices = ppfVar24;
              if (ppfVar24 != (float **)0x0) {
                if (0 < iVar33) {
                  lVar21 = 0;
                  do {
                    local_90 = (float *)0x0;
                    posix_memalign(&local_90,0x20,
                                   (long)this->kCategoryCount * (long)this->kMatrixSize * 4);
                    auVar60 = auVar41._0_16_;
                    this->gTransitionMatrices[lVar21] = local_90;
                    if (this->gTransitionMatrices[lVar21] == (float *)0x0) goto LAB_001311ec;
                    lVar21 = lVar21 + 1;
                  } while (lVar21 < this->kMatrixCount);
                }
                local_90 = (float *)0x0;
                posix_memalign(&local_90,0x20,
                               (long)this->kStateCount * (long)this->kPatternCount * 4);
                this->integrationTmp = local_90;
                sVar38 = (long)this->kStateCount * (long)this->kPatternCount * 4;
                pfVar26 = (float *)malloc(sVar38);
                this->firstDerivTmp = pfVar26;
                pfVar26 = (float *)malloc(sVar38);
                this->secondDerivTmp = pfVar26;
                local_90 = (float *)0x0;
                posix_memalign(&local_90,0x20,(long)this->kPaddedPatternCount << 2);
                this->grandDenominatorDerivTmp = local_90;
                local_90 = (float *)0x0;
                posix_memalign(&local_90,0x20,(long)this->kPaddedPatternCount << 2);
                this->grandNumeratorDerivTmp = local_90;
                this->crossProductNumeratorTmp = (float *)0x0;
                sVar38 = (long)this->kStateCount * (long)this->kPatternCount * 4;
                pfVar26 = (float *)malloc(sVar38);
                this->outLogLikelihoodsTmp = pfVar26;
                pfVar26 = (float *)malloc(sVar38);
                this->outFirstDerivativesTmp = pfVar26;
                pfVar26 = (float *)malloc(sVar38);
                this->outSecondDerivativesTmp = pfVar26;
                iVar33 = this->kPaddedPatternCount;
                sVar38 = (long)iVar33 * 4;
                pfVar26 = (float *)malloc(sVar38);
                this->zeros = pfVar26;
                pfVar27 = (float *)malloc(sVar38);
                this->ones = pfVar27;
                if (0 < (long)iVar33) {
                  uVar36 = 0;
                  memset(pfVar26,0,sVar38);
                  auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  auVar42 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                  auVar43 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  auVar44 = vpbroadcastq_avx512f();
                  do {
                    auVar45 = vpbroadcastq_avx512f();
                    auVar46 = vporq_avx512f(auVar45,auVar42);
                    auVar60 = auVar46._0_16_;
                    auVar45 = vporq_avx512f(auVar45,auVar43);
                    uVar16 = vpcmpuq_avx512f(auVar45,auVar44,2);
                    uVar17 = vpcmpuq_avx512f(auVar46,auVar44,2);
                    bVar18 = (byte)uVar17;
                    uVar40 = CONCAT11(bVar18,(byte)uVar16);
                    pfVar26 = pfVar27 + uVar36;
                    bVar2 = (bool)((byte)uVar16 & 1);
                    bVar3 = (bool)((byte)(uVar40 >> 1) & 1);
                    bVar4 = (bool)((byte)(uVar40 >> 2) & 1);
                    bVar5 = (bool)((byte)(uVar40 >> 3) & 1);
                    bVar6 = (bool)((byte)(uVar40 >> 4) & 1);
                    bVar7 = (bool)((byte)(uVar40 >> 5) & 1);
                    bVar8 = (bool)((byte)(uVar40 >> 6) & 1);
                    bVar9 = (bool)((byte)(uVar40 >> 7) & 1);
                    bVar10 = (bool)(bVar18 >> 1 & 1);
                    bVar11 = (bool)(bVar18 >> 2 & 1);
                    bVar12 = (bool)(bVar18 >> 3 & 1);
                    bVar13 = (bool)(bVar18 >> 4 & 1);
                    bVar14 = (bool)(bVar18 >> 5 & 1);
                    bVar15 = (bool)(bVar18 >> 6 & 1);
                    *pfVar26 = (float)((uint)bVar2 * auVar41._0_4_ | (uint)!bVar2 * (int)*pfVar26);
                    pfVar26[1] = (float)((uint)bVar3 * auVar41._4_4_ |
                                        (uint)!bVar3 * (int)pfVar26[1]);
                    pfVar26[2] = (float)((uint)bVar4 * auVar41._8_4_ |
                                        (uint)!bVar4 * (int)pfVar26[2]);
                    pfVar26[3] = (float)((uint)bVar5 * auVar41._12_4_ |
                                        (uint)!bVar5 * (int)pfVar26[3]);
                    pfVar26[4] = (float)((uint)bVar6 * auVar41._16_4_ |
                                        (uint)!bVar6 * (int)pfVar26[4]);
                    pfVar26[5] = (float)((uint)bVar7 * auVar41._20_4_ |
                                        (uint)!bVar7 * (int)pfVar26[5]);
                    pfVar26[6] = (float)((uint)bVar8 * auVar41._24_4_ |
                                        (uint)!bVar8 * (int)pfVar26[6]);
                    pfVar26[7] = (float)((uint)bVar9 * auVar41._28_4_ |
                                        (uint)!bVar9 * (int)pfVar26[7]);
                    pfVar26[8] = (float)((uint)(bVar18 & 1) * auVar41._32_4_ |
                                        (uint)!(bool)(bVar18 & 1) * (int)pfVar26[8]);
                    pfVar26[9] = (float)((uint)bVar10 * auVar41._36_4_ |
                                        (uint)!bVar10 * (int)pfVar26[9]);
                    pfVar26[10] = (float)((uint)bVar11 * auVar41._40_4_ |
                                         (uint)!bVar11 * (int)pfVar26[10]);
                    pfVar26[0xb] = (float)((uint)bVar12 * auVar41._44_4_ |
                                          (uint)!bVar12 * (int)pfVar26[0xb]);
                    pfVar26[0xc] = (float)((uint)bVar13 * auVar41._48_4_ |
                                          (uint)!bVar13 * (int)pfVar26[0xc]);
                    pfVar26[0xd] = (float)((uint)bVar14 * auVar41._52_4_ |
                                          (uint)!bVar14 * (int)pfVar26[0xd]);
                    pfVar26[0xe] = (float)((uint)bVar15 * auVar41._56_4_ |
                                          (uint)!bVar15 * (int)pfVar26[0xe]);
                    pfVar26[0xf] = (float)((uint)(bVar18 >> 7) * auVar41._60_4_ |
                                          (uint)!(bool)(bVar18 >> 7) * (int)pfVar26[0xf]);
                    uVar36 = uVar36 + 0x10;
                  } while ((iVar33 + 0xfU & 0xfffffff0) != uVar36);
                }
                this->kThreadingEnabled = false;
                this->kAutoPartitioningEnabled = false;
                if ((this->kFlags & 0x40000000) != 0) {
                  auVar41 = ZEXT1664(auVar60);
                  uVar20 = std::thread::hardware_concurrency();
                  if (this->kStateCount < 5) {
                    this->kMinPatternCount = 0x100;
                    if ((int)uVar20 < 0x10) {
                      this->kMinPatternCount = 0x300;
                      uVar31 = 0x300;
                    }
                    else {
                      uVar31 = 0x100;
                      if (this->kPatternCount < 0x40000) {
                        uVar20 = 0x10;
                      }
                    }
                  }
                  else {
                    uVar31 = 2;
                    this->kMinPatternCount = 2;
                  }
                  uVar1 = this->kPatternCount;
                  if (2 < (int)uVar20 && (int)uVar31 <= (int)uVar1) {
                    uVar39 = 0;
                    uVar36 = (ulong)uVar1 / (ulong)(uVar31 >> 1);
                    uVar34 = (ulong)(uVar20 >> 1);
                    if ((uint)uVar36 < uVar20 >> 1) {
                      uVar34 = uVar36;
                    }
                    pvVar28 = malloc((ulong)uVar1 * 4);
                    auVar42 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                    auVar43 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    auVar44 = vpbroadcastq_avx512f(ZEXT816(0x10));
                    auVar45 = vpbroadcastd_avx512f();
                    auVar46 = vpbroadcastq_avx512f();
                    auVar47 = vpbroadcastd_avx512f();
                    do {
                      uVar36 = vpcmpuq_avx512f(auVar43,auVar46,2);
                      iVar33 = (int)(uVar1 / uVar34);
                      iVar19 = (int)uVar39;
                      if ((uVar36 & 1) != 0) {
                        auVar41 = ZEXT464((uint)((long)((ulong)(uint)(iVar19 >> 0x1f) << 0x20 |
                                                       uVar39 & 0xffffffff) / (long)iVar33));
                      }
                      if ((uVar36 & 2) != 0) {
                        auVar60 = vpinsrd_avx(auVar41._0_16_,(iVar19 + 1) / iVar33,1);
                        auVar41 = vinserti32x4_avx512f(auVar41,auVar60,0);
                      }
                      if ((uVar36 & 4) != 0) {
                        auVar60 = vpinsrd_avx(auVar41._0_16_,(iVar19 + 2) / iVar33,2);
                        auVar41 = vinserti32x4_avx512f(auVar41,auVar60,0);
                      }
                      if ((uVar36 & 8) != 0) {
                        auVar60 = vpinsrd_avx(auVar41._0_16_,(iVar19 + 3) / iVar33,3);
                        auVar41 = vinserti32x4_avx512f(auVar41,auVar60,0);
                      }
                      auVar59 = auVar41;
                      if ((uVar36 & 0x10) != 0) {
                        auVar48 = vpbroadcastd_avx512f();
                        auVar59._0_16_ = auVar41._0_16_;
                        auVar59._16_4_ = auVar48._16_4_;
                        auVar59._20_4_ = auVar41._20_4_;
                        auVar59._24_4_ = auVar41._24_4_;
                        auVar59._28_4_ = auVar41._28_4_;
                        auVar59._32_4_ = auVar41._32_4_;
                        auVar59._36_4_ = auVar41._36_4_;
                        auVar59._40_4_ = auVar41._40_4_;
                        auVar59._44_4_ = auVar41._44_4_;
                        auVar59._48_4_ = auVar41._48_4_;
                        auVar59._52_4_ = auVar41._52_4_;
                        auVar59._56_4_ = auVar41._56_4_;
                        auVar59._60_4_ = auVar41._60_4_;
                      }
                      auVar48 = auVar59;
                      if ((uVar36 & 0x20) != 0) {
                        auVar41 = vpbroadcastd_avx512f();
                        auVar48._0_20_ = auVar59._0_20_;
                        auVar48._20_4_ = auVar41._20_4_;
                        auVar48._24_4_ = auVar59._24_4_;
                        auVar48._28_4_ = auVar59._28_4_;
                        auVar48._32_4_ = auVar59._32_4_;
                        auVar48._36_4_ = auVar59._36_4_;
                        auVar48._40_4_ = auVar59._40_4_;
                        auVar48._44_4_ = auVar59._44_4_;
                        auVar48._48_4_ = auVar59._48_4_;
                        auVar48._52_4_ = auVar59._52_4_;
                        auVar48._56_4_ = auVar59._56_4_;
                        auVar48._60_4_ = auVar59._60_4_;
                      }
                      auVar49 = auVar48;
                      if ((uVar36 & 0x40) != 0) {
                        auVar41 = vpbroadcastd_avx512f();
                        auVar49._0_24_ = auVar48._0_24_;
                        auVar49._24_4_ = auVar41._24_4_;
                        auVar49._28_4_ = auVar48._28_4_;
                        auVar49._32_4_ = auVar48._32_4_;
                        auVar49._36_4_ = auVar48._36_4_;
                        auVar49._40_4_ = auVar48._40_4_;
                        auVar49._44_4_ = auVar48._44_4_;
                        auVar49._48_4_ = auVar48._48_4_;
                        auVar49._52_4_ = auVar48._52_4_;
                        auVar49._56_4_ = auVar48._56_4_;
                        auVar49._60_4_ = auVar48._60_4_;
                      }
                      auVar50 = auVar49;
                      if ((uVar36 & 0x80) != 0) {
                        auVar41 = vpbroadcastd_avx512f();
                        auVar50._0_28_ = auVar49._0_28_;
                        auVar50._28_4_ = auVar41._28_4_;
                        auVar50._32_4_ = auVar49._32_4_;
                        auVar50._36_4_ = auVar49._36_4_;
                        auVar50._40_4_ = auVar49._40_4_;
                        auVar50._44_4_ = auVar49._44_4_;
                        auVar50._48_4_ = auVar49._48_4_;
                        auVar50._52_4_ = auVar49._52_4_;
                        auVar50._56_4_ = auVar49._56_4_;
                        auVar50._60_4_ = auVar49._60_4_;
                      }
                      uVar36 = vpcmpuq_avx512f(auVar42,auVar46,2);
                      auVar51 = auVar50;
                      if ((uVar36 & 1) != 0) {
                        auVar41 = vpbroadcastd_avx512f();
                        auVar51._0_32_ = auVar50._0_32_;
                        auVar51._32_4_ = auVar41._32_4_;
                        auVar51._36_4_ = auVar50._36_4_;
                        auVar51._40_4_ = auVar50._40_4_;
                        auVar51._44_4_ = auVar50._44_4_;
                        auVar51._48_4_ = auVar50._48_4_;
                        auVar51._52_4_ = auVar50._52_4_;
                        auVar51._56_4_ = auVar50._56_4_;
                        auVar51._60_4_ = auVar50._60_4_;
                      }
                      auVar52 = auVar51;
                      if ((uVar36 & 2) != 0) {
                        auVar41 = vpbroadcastd_avx512f();
                        auVar52._0_36_ = auVar51._0_36_;
                        auVar52._36_4_ = auVar41._36_4_;
                        auVar52._40_4_ = auVar51._40_4_;
                        auVar52._44_4_ = auVar51._44_4_;
                        auVar52._48_4_ = auVar51._48_4_;
                        auVar52._52_4_ = auVar51._52_4_;
                        auVar52._56_4_ = auVar51._56_4_;
                        auVar52._60_4_ = auVar51._60_4_;
                      }
                      auVar53 = auVar52;
                      if ((uVar36 & 4) != 0) {
                        auVar41 = vpbroadcastd_avx512f();
                        auVar53._0_40_ = auVar52._0_40_;
                        auVar53._40_4_ = auVar41._40_4_;
                        auVar53._44_4_ = auVar52._44_4_;
                        auVar53._48_4_ = auVar52._48_4_;
                        auVar53._52_4_ = auVar52._52_4_;
                        auVar53._56_4_ = auVar52._56_4_;
                        auVar53._60_4_ = auVar52._60_4_;
                      }
                      auVar54 = auVar53;
                      if ((uVar36 & 8) != 0) {
                        auVar41 = vpbroadcastd_avx512f();
                        auVar54._0_44_ = auVar53._0_44_;
                        auVar54._44_4_ = auVar41._44_4_;
                        auVar54._48_4_ = auVar53._48_4_;
                        auVar54._52_4_ = auVar53._52_4_;
                        auVar54._56_4_ = auVar53._56_4_;
                        auVar54._60_4_ = auVar53._60_4_;
                      }
                      auVar55 = auVar54;
                      if ((uVar36 & 0x10) != 0) {
                        auVar41 = vpbroadcastd_avx512f();
                        auVar55._0_48_ = auVar54._0_48_;
                        auVar55._48_4_ = auVar41._48_4_;
                        auVar55._52_4_ = auVar54._52_4_;
                        auVar55._56_4_ = auVar54._56_4_;
                        auVar55._60_4_ = auVar54._60_4_;
                      }
                      auVar56 = auVar55;
                      if ((uVar36 & 0x20) != 0) {
                        auVar41 = vpbroadcastd_avx512f();
                        auVar56._0_52_ = auVar55._0_52_;
                        auVar56._52_4_ = auVar41._52_4_;
                        auVar56._56_4_ = auVar55._56_4_;
                        auVar56._60_4_ = auVar55._60_4_;
                      }
                      auVar57 = auVar56;
                      if ((uVar36 & 0x40) != 0) {
                        auVar41 = vpbroadcastd_avx512f();
                        auVar57._0_56_ = auVar56._0_56_;
                        auVar57._56_4_ = auVar41._56_4_;
                        auVar57._60_4_ = auVar56._60_4_;
                      }
                      auVar58 = auVar57;
                      if ((uVar36 & 0x80) != 0) {
                        auVar41 = vpbroadcastd_avx512f();
                        auVar58._60_4_ = auVar41._60_4_;
                        auVar58._0_60_ = auVar57._0_60_;
                      }
                      uVar36 = vpcmpgtd_avx512f(auVar45,auVar58);
                      auVar43 = vpaddq_avx512f(auVar43,auVar44);
                      auVar42 = vpaddq_avx512f(auVar42,auVar44);
                      auVar59 = vpblendmd_avx512f(auVar47,auVar58);
                      bVar2 = (bool)((byte)uVar36 & 1);
                      auVar41._0_4_ = (uint)bVar2 * auVar59._0_4_ | (uint)!bVar2 * auVar58._0_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 1) & 1);
                      auVar41._4_4_ = (uint)bVar2 * auVar59._4_4_ | (uint)!bVar2 * auVar58._4_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 2) & 1);
                      auVar41._8_4_ = (uint)bVar2 * auVar59._8_4_ | (uint)!bVar2 * auVar58._8_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 3) & 1);
                      auVar41._12_4_ = (uint)bVar2 * auVar59._12_4_ | (uint)!bVar2 * auVar58._12_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 4) & 1);
                      auVar41._16_4_ = (uint)bVar2 * auVar59._16_4_ | (uint)!bVar2 * auVar58._16_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 5) & 1);
                      auVar41._20_4_ = (uint)bVar2 * auVar59._20_4_ | (uint)!bVar2 * auVar58._20_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 6) & 1);
                      auVar41._24_4_ = (uint)bVar2 * auVar59._24_4_ | (uint)!bVar2 * auVar58._24_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 7) & 1);
                      auVar41._28_4_ = (uint)bVar2 * auVar59._28_4_ | (uint)!bVar2 * auVar58._28_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 8) & 1);
                      auVar41._32_4_ = (uint)bVar2 * auVar59._32_4_ | (uint)!bVar2 * auVar58._32_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 9) & 1);
                      auVar41._36_4_ = (uint)bVar2 * auVar59._36_4_ | (uint)!bVar2 * auVar58._36_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 10) & 1);
                      auVar41._40_4_ = (uint)bVar2 * auVar59._40_4_ | (uint)!bVar2 * auVar58._40_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 0xb) & 1);
                      auVar41._44_4_ = (uint)bVar2 * auVar59._44_4_ | (uint)!bVar2 * auVar58._44_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 0xc) & 1);
                      auVar41._48_4_ = (uint)bVar2 * auVar59._48_4_ | (uint)!bVar2 * auVar58._48_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 0xd) & 1);
                      auVar41._52_4_ = (uint)bVar2 * auVar59._52_4_ | (uint)!bVar2 * auVar58._52_4_;
                      bVar2 = (bool)((byte)(uVar36 >> 0xe) & 1);
                      auVar41._56_4_ = (uint)bVar2 * auVar59._56_4_ | (uint)!bVar2 * auVar58._56_4_;
                      bVar2 = SUB81(uVar36 >> 0xf,0);
                      auVar41._60_4_ = (uint)bVar2 * auVar59._60_4_ | (uint)!bVar2 * auVar58._60_4_;
                      auVar59 = vmovdqu32_avx512f(auVar41);
                      *(undefined1 (*) [64])((long)pvVar28 + uVar39 * 4) = auVar59;
                      uVar39 = uVar39 + 0x10;
                    } while ((uVar1 + 0xf & 0xfffffff0) != uVar39);
                    (*(this->super_BeagleImpl)._vptr_BeagleImpl[0xe])(this,uVar34,pvVar28);
                    piVar29 = (int *)malloc((long)this->kPartitionCount *
                                            (long)*(int *)&(this->super_BeagleImpl).field_0xc * 0x24
                                           );
                    this->gAutoPartitionOperations = piVar29;
                    if (this->kMinPatternCount * 4 <= this->kPatternCount) {
                      piVar29 = (int *)malloc(uVar34 * 4);
                      auVar41 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                      auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      auVar43 = vpmovsxbd_avx512f(_DAT_00141b90);
                      auVar44 = vpbroadcastd_avx512f(ZEXT416(0x10));
                      auVar45 = vpbroadcastq_avx512f(ZEXT816(0x10));
                      this->gAutoPartitionIndices = piVar29;
                      auVar46 = vpbroadcastq_avx512f();
                      uVar36 = 0;
                      do {
                        vpcmpuq_avx512f(auVar42,auVar46,2);
                        vpcmpuq_avx512f(auVar41,auVar46,2);
                        auVar42 = vpaddq_avx512f(auVar42,auVar45);
                        auVar41 = vpaddq_avx512f(auVar41,auVar45);
                        auVar47 = vmovdqu32_avx512f(auVar43);
                        *(undefined1 (*) [64])(piVar29 + uVar36) = auVar47;
                        uVar36 = uVar36 + 0x10;
                        auVar43 = vpaddd_avx512f(auVar43,auVar44);
                      } while (((int)uVar34 + 0xfU & 0x7ffffff0) != uVar36);
                      pdVar23 = (double *)malloc(uVar34 << 3);
                      this->gAutoPartitionOutSumLogLikelihoods = pdVar23;
                      this->kAutoRootPartitioningEnabled = false;
                    }
                    this->kAutoPartitioningEnabled = false;
                  }
                }
                return 0;
              }
            }
          }
        }
      }
    }
  }
LAB_001311ec:
  puVar30 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar30 = __cxa_init_primary_exception;
  __cxa_throw(puVar30,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::createInstance(int tipCount,
                                  int partialsBufferCount,
                                  int compactBufferCount,
                                  int stateCount,
                                  int patternCount,
                                  int eigenDecompositionCount,
                                  int matrixCount,
                                  int categoryCount,
                                  int scaleBufferCount,
                                  int resourceNumber,
                                  int pluginResourceNumber,
                                  long preferenceFlags,
                                  long requirementFlags) {
    if (DEBUGGING_OUTPUT)
        std::cerr << "in BeagleCPUImpl::initialize\n" ;

    if (DOUBLE_PRECISION) {
        realtypeMin = DBL_MIN;
        scalingExponentThreshold = 200;
    } else {
        realtypeMin = FLT_MIN;
        scalingExponentThreshold = 20;
    }

    kBufferCount = partialsBufferCount + compactBufferCount;
    kTipCount = tipCount;
    assert(kBufferCount > kTipCount);
    kStateCount = stateCount;
    kPatternCount = patternCount;

    kPartitionCount = 1;
    kMaxPartitionCount = kPartitionCount;
    kPartitionsInitialised = false;
    kPatternsReordered = false;

    kInternalPartialsBufferCount = kBufferCount - kTipCount;

    kTransPaddedStateCount = kStateCount + T_PAD;
    kPartialsPaddedStateCount = kStateCount + P_PAD;

    // Handle possible padding of pattern sites for vectorization
    int modulus = getPaddedPatternsModulus();
    kPaddedPatternCount = kPatternCount;
    int remainder = kPatternCount % modulus;
    if (remainder != 0) {
        kPaddedPatternCount += modulus - remainder;
    }
    kExtraPatterns = kPaddedPatternCount - kPatternCount;

    kMatrixCount = matrixCount;
    kEigenDecompCount = eigenDecompositionCount;
    kCategoryCount = categoryCount;
    kScaleBufferCount = scaleBufferCount;

    kMatrixSize = (T_PAD + kStateCount) * kStateCount;

    int scaleBufferSize = kPaddedPatternCount;

    kFlags = 0;

    if (preferenceFlags & BEAGLE_FLAG_SCALING_AUTO || requirementFlags & BEAGLE_FLAG_SCALING_AUTO) {
        kFlags |= BEAGLE_FLAG_SCALING_AUTO;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_ALWAYS || requirementFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
        kFlags |= BEAGLE_FLAG_SCALING_ALWAYS;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
        kScaleBufferCount = kInternalPartialsBufferCount + 1; // +1 for temp buffer used by edgelikelihood
    } else if (preferenceFlags & BEAGLE_FLAG_SCALING_DYNAMIC || requirementFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
        kFlags |= BEAGLE_FLAG_SCALING_DYNAMIC;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    } else if (preferenceFlags & BEAGLE_FLAG_SCALERS_LOG || requirementFlags & BEAGLE_FLAG_SCALERS_LOG) {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_LOG;
    } else {
        kFlags |= BEAGLE_FLAG_SCALING_MANUAL;
        kFlags |= BEAGLE_FLAG_SCALERS_RAW;
    }

    if (requirementFlags & BEAGLE_FLAG_EIGEN_COMPLEX || preferenceFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        kFlags |= BEAGLE_FLAG_EIGEN_COMPLEX;
    else
        kFlags |= BEAGLE_FLAG_EIGEN_REAL;

    if (requirementFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED || preferenceFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED)
        kFlags |= BEAGLE_FLAG_INVEVEC_TRANSPOSED;
    else
        kFlags |= BEAGLE_FLAG_INVEVEC_STANDARD;

    if (requirementFlags & BEAGLE_FLAG_THREADING_CPP || preferenceFlags & BEAGLE_FLAG_THREADING_CPP)
        kFlags |= BEAGLE_FLAG_THREADING_CPP;
    else
        kFlags |= BEAGLE_FLAG_THREADING_NONE;

    if (kFlags & BEAGLE_FLAG_EIGEN_COMPLEX)
        gEigenDecomposition = new EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount,kCategoryCount,kFlags);
    else
        gEigenDecomposition = new EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>(kEigenDecompCount,
                kStateCount, kCategoryCount,kFlags);

    gCategoryRates = (double**) calloc(sizeof(double), kEigenDecompCount);
    if (gCategoryRates == NULL)
        throw std::bad_alloc();

    gPatternWeights = (double*) malloc(sizeof(double) * kPatternCount);
    if (gPatternWeights == NULL)
        throw std::bad_alloc();

    // TODO: if pattern padding is implemented this will create problems with setTipPartials
    kPartialsSize = kPaddedPatternCount * kPartialsPaddedStateCount * kCategoryCount;

    gPartials = (REALTYPE**) malloc(sizeof(REALTYPE*) * kBufferCount);
    if (gPartials == NULL)
     throw std::bad_alloc();

    gStateFrequencies = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gStateFrequencies == NULL)
        throw std::bad_alloc();

    gCategoryWeights = (REALTYPE**) calloc(sizeof(REALTYPE*), kEigenDecompCount);
    if (gCategoryWeights == NULL)
        throw std::bad_alloc();

    // assigning kBufferCount to this array so that we can just check if a tipStateBuffer is
    // allocated
    gTipStates = (int**) malloc(sizeof(int*) * kBufferCount);
    if (gTipStates == NULL)
        throw std::bad_alloc();

    for (int i = 0; i < kBufferCount; i++) {
        gPartials[i] = NULL;
        gTipStates[i] = NULL;
    }

    for (int i = kTipCount; i < kBufferCount; i++) {
        gPartials[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        if (gPartials[i] == NULL)
            throw std::bad_alloc();
    }

    gScaleBuffers = NULL;

    gAutoScaleBuffers = NULL;

    if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        gAutoScaleBuffers = (signed short**) malloc(sizeof(signed short*) * kScaleBufferCount);
        if (gAutoScaleBuffers == NULL)
            throw std::bad_alloc();
        for (int i = 0; i < kScaleBufferCount; i++) {
            gAutoScaleBuffers[i] = (signed short*) malloc(sizeof(signed short) * scaleBufferSize);
            if (gAutoScaleBuffers[i] == 0L)
                throw std::bad_alloc();
        }
        gActiveScalingFactors = (int*) malloc(sizeof(int) * kInternalPartialsBufferCount);
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*));
        gScaleBuffers[0] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);
    } else {
        gScaleBuffers = (REALTYPE**) malloc(sizeof(REALTYPE*) * kScaleBufferCount);
        if (gScaleBuffers == NULL)
            throw std::bad_alloc();

        for (int i = 0; i < kScaleBufferCount; i++) {
            gScaleBuffers[i] = (REALTYPE*) malloc(sizeof(REALTYPE) * scaleBufferSize);

            if (gScaleBuffers[i] == 0L)
                throw std::bad_alloc();


            if (kFlags & BEAGLE_FLAG_SCALING_DYNAMIC) {
                for (int j=0; j < scaleBufferSize; j++) {
                    gScaleBuffers[i][j] = 1.0;
                }
            }
        }
    }


    gTransitionMatrices = (REALTYPE**) malloc(sizeof(REALTYPE*) * kMatrixCount);
    if (gTransitionMatrices == NULL)
        throw std::bad_alloc();
    for (int i = 0; i < kMatrixCount; i++) {
        gTransitionMatrices[i] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kMatrixSize * kCategoryCount);
        if (gTransitionMatrices[i] == 0L)
            throw std::bad_alloc();
    }

    integrationTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kStateCount);
    firstDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    secondDerivTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

//    cLikelihoodTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount * kCategoryCount);
    grandDenominatorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount); // TODO Deprecate in favor of integrationTmp
    grandNumeratorDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPaddedPatternCount);
    crossProductNumeratorTmp = nullptr;
//    grandNumeratorLowerBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);
//    grandNumeratorUpperBoundDerivTmp = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPatternCount);

    outLogLikelihoodsTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outFirstDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);
    outSecondDerivativesTmp = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount * kStateCount);

    zeros = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    ones = (REALTYPE*) malloc(sizeof(REALTYPE) * kPaddedPatternCount);
    for(int i = 0; i < kPaddedPatternCount; i++) {
        zeros[i] = 0.0;
        ones[i] = 1.0;
    }

    kThreadingEnabled = false;
    kAutoPartitioningEnabled = false;
    if (kFlags & BEAGLE_FLAG_THREADING_CPP) {
        int hardwareThreads = std::thread::hardware_concurrency();
        if (kStateCount <= 4) {
            kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_LOW;
            if (hardwareThreads < BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD) {
                kMinPatternCount = BEAGLE_CPU_ASYNC_MIN_PATTERN_COUNT_HIGH;
            } else if (kPatternCount < BEAGLE_CPU_ASYNC_LIMIT_PATTERN_COUNT) {
                hardwareThreads = BEAGLE_CPU_ASYNC_HW_THREAD_COUNT_THRESHOLD;
            }
        } else {
            // todo: assess minimum pattern count for efficient auto-threading
            //       for higher state-count values
            kMinPatternCount = 2;
        }
        if (kPatternCount >= kMinPatternCount && hardwareThreads > 2) {
            int partitionCount = kPatternCount/(kMinPatternCount/2);
            if (partitionCount > hardwareThreads/2) {
                partitionCount = hardwareThreads/2;
            }
            int* patternPartitions = (int*) malloc(sizeof(int) * kPatternCount);
            int partitionSize = kPatternCount/partitionCount;
            for (int i=0; i<kPatternCount; i++) {
                int sitePartition = i/partitionSize;
                if (sitePartition > partitionCount - 1)
                    sitePartition = partitionCount - 1;
                patternPartitions[i] = sitePartition;
            }
            setPatternPartitions(partitionCount, patternPartitions);

            gAutoPartitionOperations = (int*) malloc(sizeof(int) * kBufferCount * kPartitionCount * BEAGLE_PARTITION_OP_COUNT);

            if (kPatternCount >= kMinPatternCount*4) {
                gAutoPartitionIndices = (int*) malloc(sizeof(int) * partitionCount);
                for (int i=0; i<partitionCount; i++) {
                    gAutoPartitionIndices[i] = i;
                }
                gAutoPartitionOutSumLogLikelihoods = (double*) malloc(sizeof(double) * partitionCount);
                kAutoRootPartitioningEnabled = false; //TODO: XJ: need to change this back to true
            }
            // TODO: XJ: need to change below back to true
            kAutoPartitioningEnabled = false;
        }
    }

    return BEAGLE_SUCCESS;
}